

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

void __thiscall
Js::IntlEngineInterfaceExtensionObject::IntlEngineInterfaceExtensionObject
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  Type *addr;
  
  (this->super_EngineExtensionObjectBase)._vptr_EngineExtensionObjectBase =
       (_func_int **)&PTR___cxa_pure_virtual_0150c488;
  (this->super_EngineExtensionObjectBase).extensionKind = EngineInterfaceExtensionKind_Intl;
  addr = &(this->super_EngineExtensionObjectBase).scriptContext;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_EngineExtensionObjectBase).scriptContext.ptr = scriptContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->super_EngineExtensionObjectBase).hasBytecode = false;
  (this->super_EngineExtensionObjectBase)._vptr_EngineExtensionObjectBase =
       (_func_int **)&PTR_Initialize_0150c440;
  (this->dateToLocaleTimeString).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleDateString).ptr = (JavascriptFunction *)0x0;
  (this->numberToLocaleString).ptr = (JavascriptFunction *)0x0;
  (this->stringLocaleCompare).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleString).ptr = (JavascriptFunction *)0x0;
  (this->intlNativeInterfaces).ptr = (DynamicObject *)0x0;
  *(undefined8 *)((long)&(this->intlNativeInterfaces).ptr + 1) = 0;
  *(undefined8 *)((long)&(this->intlByteCode).ptr + 1) = 0;
  return;
}

Assistant:

IntlEngineInterfaceExtensionObject::IntlEngineInterfaceExtensionObject(Js::ScriptContext* scriptContext) :
        EngineExtensionObjectBase(EngineInterfaceExtensionKind_Intl, scriptContext),
        dateToLocaleString(nullptr),
        dateToLocaleTimeString(nullptr),
        dateToLocaleDateString(nullptr),
        numberToLocaleString(nullptr),
        stringLocaleCompare(nullptr),
        intlNativeInterfaces(nullptr),
        intlByteCode(nullptr),
        wasInitialized(false)
    {
    }